

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::BlockStatementSyntax::BlockStatementSyntax
          (BlockStatementSyntax *this,SyntaxKind kind,NamedLabelSyntax *label,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token begin,
          NamedBlockClauseSyntax *blockName,SyntaxList<slang::syntax::SyntaxNode> *items,Token end,
          NamedBlockClauseSyntax *endBlockName)

{
  Token TVar1;
  iterator ppSVar2;
  undefined8 uVar3;
  SyntaxNode *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::SyntaxNode> *__range2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  NamedLabelSyntax *label_local;
  SyntaxKind kind_local;
  BlockStatementSyntax *this_local;
  Token begin_local;
  
  TVar1 = end;
  uVar3 = begin._0_8_;
  StatementSyntax::StatementSyntax(&this->super_StatementSyntax,kind,label,attributes);
  (this->begin).kind = (short)uVar3;
  (this->begin).field_0x2 = (char)((ulong)uVar3 >> 0x10);
  (this->begin).numFlags = (NumericTokenFlags)(char)((ulong)uVar3 >> 0x18);
  (this->begin).rawLen = (int)((ulong)uVar3 >> 0x20);
  (this->begin).info = begin.info;
  this->blockName = blockName;
  SyntaxList<slang::syntax::SyntaxNode>::SyntaxList(&this->items,items);
  (this->end).kind = end.kind;
  (this->end).field_0x2 = end._2_1_;
  (this->end).numFlags = (NumericTokenFlags)end.numFlags.raw;
  (this->end).rawLen = end.rawLen;
  end.info = TVar1.info;
  (this->end).info = end.info;
  this->endBlockName = endBlockName;
  if (this->blockName != (NamedBlockClauseSyntax *)0x0) {
    (this->blockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  __end2 = nonstd::span_lite::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>::begin
                     (&(this->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>
                     );
  ppSVar2 = nonstd::span_lite::span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>::end
                      (&(this->items).
                        super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>);
  for (; __end2 != ppSVar2; __end2 = __end2 + 1) {
    (*__end2)->parent = (SyntaxNode *)this;
  }
  if (this->endBlockName != (NamedBlockClauseSyntax *)0x0) {
    (this->endBlockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

BlockStatementSyntax(SyntaxKind kind, NamedLabelSyntax* label, const SyntaxList<AttributeInstanceSyntax>& attributes, Token begin, NamedBlockClauseSyntax* blockName, const SyntaxList<SyntaxNode>& items, Token end, NamedBlockClauseSyntax* endBlockName) :
        StatementSyntax(kind, label, attributes), begin(begin), blockName(blockName), items(items), end(end), endBlockName(endBlockName) {
        if (this->blockName) this->blockName->parent = this;
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
        if (this->endBlockName) this->endBlockName->parent = this;
    }